

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

void __thiscall
icu_63::DateTimePatternGenerator::initData
          (DateTimePatternGenerator *this,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  
  this->skipMatcher = (DateTimeMatcher *)0x0;
  this->fAvailableFormatKeyHash = (Hashtable *)0x0;
  addCanonicalItems(this,status);
  addICUPatterns(this,locale,status);
  addCLDRData(this,locale,status);
  setDateTimeFromCalendar(this,locale,status);
  setDecimalSymbols(this,locale,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((anonymous_namespace)::initOnce != 2) {
      UVar1 = umtx_initImplPreInit((UInitOnce *)&(anonymous_namespace)::initOnce);
      if (UVar1 != '\0') {
        loadAllowedHourFormatsData(status);
        DAT_0048e1ac = *status;
        umtx_initImplPostInit((UInitOnce *)&(anonymous_namespace)::initOnce);
        goto LAB_002e4c2e;
      }
    }
    if (U_ZERO_ERROR < DAT_0048e1ac) {
      *status = DAT_0048e1ac;
    }
  }
LAB_002e4c2e:
  getAllowedHourFormats(this,locale,status);
  this->internalErrorCode = *status;
  return;
}

Assistant:

void
DateTimePatternGenerator::initData(const Locale& locale, UErrorCode &status) {
    //const char *baseLangName = locale.getBaseName(); // unused

    skipMatcher = nullptr;
    fAvailableFormatKeyHash=nullptr;
    addCanonicalItems(status);
    addICUPatterns(locale, status);
    addCLDRData(locale, status);
    setDateTimeFromCalendar(locale, status);
    setDecimalSymbols(locale, status);
    umtx_initOnce(initOnce, loadAllowedHourFormatsData, status);
    getAllowedHourFormats(locale, status);
    // If any of the above methods failed then the object is in an invalid state.
    internalErrorCode = status;
}